

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O3

Vector * Intersection(Vector *Va,Vector *Vb)

{
  int iVar1;
  Vector *V;
  long lVar2;
  int iVar3;
  uint uVar4;
  
  V = (Vector *)malloc(0x10);
  iVar1 = Vb->VectorLength;
  iVar3 = Va->VectorLength;
  if (iVar1 < Va->VectorLength) {
    iVar3 = iVar1;
  }
  InitVector(V,iVar3);
  if (0 < iVar1) {
    uVar4 = 0;
    do {
      iVar3 = 0;
      if ((-1 < (int)uVar4) && ((int)uVar4 < Vb->VectorLength)) {
        iVar3 = Vb->elements[uVar4];
      }
      if (0 < (long)Va->VectorLength) {
        lVar2 = 0;
        do {
          if (Va->elements[lVar2] == iVar3) {
            Insert(V,iVar3,0);
            uVar4 = uVar4 + 1;
            break;
          }
          lVar2 = lVar2 + 1;
        } while (Va->VectorLength != lVar2);
      }
    } while ((int)uVar4 < iVar1);
  }
  return V;
}

Assistant:

Vector *Intersection(Vector *Va,Vector *Vb)  //向量交集
{  //求Va和Vb中的相同元素，并存入Vc
    int m,n,i,j,k;
    ElementType x;
    Vector *Vc = (Vector *)malloc(sizeof(Vector));
    n = Va->VectorLength;
    m = Vb->VectorLength;
    InitVector(Vc,(m>n)?n:m);  //取较小的向量大小作为向量交集的初始化大小
    i = 0;
    j = 0;
    while(i<m)
    {
        x = GetNode(Vb,i);  //从Vb中取一结点
        k = Find(Va,x);  //在Va中查找等值结点
        if(k != -1)  //若找到等值结点
        {
            Insert(Vc, x, j);
            i++;
        }
    }
    return Vc;
}